

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall cmGlobalGenerator::FillProjectMap(cmGlobalGenerator *this)

{
  iterator __position;
  bool bVar1;
  int iVar2;
  vector<cmLocalGenerator*,std::allocator<cmLocalGenerator*>> *this_00;
  string name;
  cmLocalGenerator *localGen;
  string snpProjName;
  cmStateSnapshot snp;
  key_type local_c0;
  cmLocalGenerator *local_a0;
  pointer local_98;
  pointer local_90;
  string local_88;
  cmStateSnapshot local_68;
  cmStateSnapshot local_48;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
  ::clear(&(this->ProjectMap)._M_t);
  local_90 = (this->LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_98 = (this->LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (local_90 != local_98) {
    do {
      local_a0 = *local_90;
      cmLocalGenerator::GetStateSnapshot(&local_68,local_a0);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      local_c0._M_string_length = 0;
      local_c0.field_2._M_local_buf[0] = '\0';
      do {
        cmStateSnapshot::GetProjectName_abi_cxx11_(&local_88,&local_68);
        if (local_c0._M_string_length == local_88._M_string_length) {
          if (local_c0._M_string_length != 0) {
            iVar2 = bcmp(local_c0._M_dataplus._M_p,local_88._M_dataplus._M_p,
                         local_c0._M_string_length);
            if (iVar2 != 0) goto LAB_0018f12d;
          }
        }
        else {
LAB_0018f12d:
          std::__cxx11::string::_M_assign((string *)&local_c0);
          this_00 = (vector<cmLocalGenerator*,std::allocator<cmLocalGenerator*>> *)
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
                    ::operator[](&this->ProjectMap,&local_c0);
          __position._M_current = *(cmLocalGenerator ***)(this_00 + 8);
          if (__position._M_current == *(cmLocalGenerator ***)(this_00 + 0x10)) {
            std::vector<cmLocalGenerator*,std::allocator<cmLocalGenerator*>>::
            _M_realloc_insert<cmLocalGenerator*const&>(this_00,__position,&local_a0);
          }
          else {
            *__position._M_current = local_a0;
            *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
          }
        }
        cmStateSnapshot::GetBuildsystemDirectoryParent(&local_48,&local_68);
        local_68.Position.Position = local_48.Position.Position;
        local_68.State = local_48.State;
        local_68.Position.Tree = local_48.Position.Tree;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        bVar1 = cmStateSnapshot::IsValid(&local_68);
      } while (bVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,
                        CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                                 local_c0.field_2._M_local_buf[0]) + 1);
      }
      local_90 = local_90 + 1;
    } while (local_90 != local_98);
  }
  return;
}

Assistant:

void cmGlobalGenerator::FillProjectMap()
{
  this->ProjectMap.clear(); // make sure we start with a clean map
  for (cmLocalGenerator* localGen : this->LocalGenerators) {
    // for each local generator add all projects
    cmStateSnapshot snp = localGen->GetStateSnapshot();
    std::string name;
    do {
      std::string snpProjName = snp.GetProjectName();
      if (name != snpProjName) {
        name = snpProjName;
        this->ProjectMap[name].push_back(localGen);
      }
      snp = snp.GetBuildsystemDirectoryParent();
    } while (snp.IsValid());
  }
}